

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_pkey.c
# Opt level: O0

int PEM_write_bio_PrivateKey_traditional
              (BIO *bp,EVP_PKEY *x,EVP_CIPHER *enc,uchar *kstr,int klen,pem_password_cb *cb,void *u)

{
  int iVar1;
  uchar *in_RCX;
  EVP_CIPHER *in_RDX;
  EVP_PKEY *in_RSI;
  BIO *in_RDI;
  int in_R8D;
  undefined1 *in_R9;
  void *in_stack_00000008;
  int ret;
  EVP_PKEY *copy;
  char pem_str [80];
  char *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  int line;
  char *in_stack_ffffffffffffff60;
  EVP_PKEY *pkey;
  EVP_PKEY **in_stack_ffffffffffffff78;
  EVP_PKEY *local_18;
  int local_4;
  
  line = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  pkey = (EVP_PKEY *)0x0;
  if ((((in_RSI->pkey).ptr != (char *)0x0) ||
      (local_18 = in_RSI, in_RSI[1].attributes != (stack_st_X509_ATTRIBUTE *)0x0)) &&
     (local_18 = in_RSI, *(long *)&in_RSI[1].save_parameters != 0)) {
    iVar1 = evp_pkey_copy_downgraded(in_stack_ffffffffffffff78,(EVP_PKEY *)0x0);
    local_18 = in_RSI;
    if (iVar1 != 0) {
      local_18 = pkey;
    }
  }
  if ((*(long *)&local_18->references == 0) ||
     (*(long *)(*(long *)&local_18->references + 0xc0) == 0)) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffff60,line,in_stack_ffffffffffffff50);
    ERR_set_error(9,0x6e,(char *)0x0);
    local_4 = 0;
  }
  else {
    BIO_snprintf(&stack0xffffffffffffff78,0x50,"%s PRIVATE KEY",
                 *(undefined8 *)(*(long *)&local_18->references + 0x10));
    local_4 = PEM_ASN1_write_bio(i2d_PrivateKey,&stack0xffffffffffffff78,in_RDI,local_18,in_RDX,
                                 in_RCX,in_R8D,in_R9,in_stack_00000008);
    EVP_PKEY_free(pkey);
  }
  return local_4;
}

Assistant:

int PEM_write_bio_PrivateKey_traditional(BIO *bp, const EVP_PKEY *x,
                                         const EVP_CIPHER *enc,
                                         const unsigned char *kstr, int klen,
                                         pem_password_cb *cb, void *u)
{
    char pem_str[80];
    EVP_PKEY *copy = NULL;
    int ret;

    if (evp_pkey_is_assigned(x)
        && evp_pkey_is_provided(x)
        && evp_pkey_copy_downgraded(&copy, x))
        x = copy;

    if (x->ameth == NULL || x->ameth->old_priv_encode == NULL) {
        ERR_raise(ERR_LIB_PEM, PEM_R_UNSUPPORTED_PUBLIC_KEY_TYPE);
        return 0;
    }
    BIO_snprintf(pem_str, 80, "%s PRIVATE KEY", x->ameth->pem_str);
    ret = PEM_ASN1_write_bio((i2d_of_void *)i2d_PrivateKey,
                             pem_str, bp, x, enc, kstr, klen, cb, u);

    EVP_PKEY_free(copy);
    return ret;
}